

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roipooling.cpp
# Opt level: O0

int __thiscall
ncnn::ROIPooling::forward
          (ROIPooling *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  undefined4 uVar1;
  int *piVar2;
  float *pfVar3;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RDX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RSI;
  long in_RDI;
  bool bVar4;
  float fVar5;
  double dVar6;
  undefined4 extraout_XMM0_Db;
  int index;
  int x;
  int y;
  float max;
  bool is_empty;
  int wend;
  int hend;
  int wstart;
  int hstart;
  int pw;
  int ph;
  float *outptr;
  float *ptr;
  int q;
  float bin_size_h;
  float bin_size_w;
  int roi_h;
  int roi_w;
  int roi_y2;
  int roi_x2;
  int roi_y1;
  int roi_x1;
  float *roi_ptr;
  Mat *top_blob;
  Mat *roi_blob;
  int channels;
  size_t elemsize;
  int h;
  int w;
  Mat *bottom_blob;
  Mat *m;
  Mat *m_1;
  float local_3a8;
  bool local_391;
  Allocator *in_stack_fffffffffffffc70;
  size_t in_stack_fffffffffffffc78;
  undefined8 in_stack_fffffffffffffc80;
  int _c;
  undefined8 in_stack_fffffffffffffc88;
  Mat *in_stack_fffffffffffffc90;
  int local_328;
  int local_324;
  float local_320;
  bool local_319;
  int local_318 [5];
  int local_304;
  int local_300;
  int local_2fc;
  int local_2f8;
  int local_2f4;
  undefined8 local_2f0;
  undefined8 local_2e8;
  undefined8 local_2e0;
  undefined4 local_2d8;
  Allocator *local_2d0;
  undefined4 local_2c8;
  undefined4 local_2c4;
  undefined4 local_2c0;
  undefined4 local_2bc;
  undefined4 local_2b8;
  undefined8 local_2b0;
  void *local_2a8;
  undefined8 local_290;
  undefined8 local_288;
  undefined8 local_280;
  undefined4 local_278;
  Allocator *local_270;
  undefined4 local_268;
  undefined4 local_264;
  undefined4 local_260;
  undefined4 local_25c;
  undefined4 local_258;
  undefined8 local_250;
  void *local_248;
  int local_23c;
  float local_238;
  float local_234;
  int local_230;
  int local_22c;
  int local_228;
  int local_224;
  int local_220;
  int local_21c;
  int local_218;
  int local_214;
  int local_210;
  int local_20c;
  float *local_208;
  reference local_200;
  const_reference local_1f8;
  int local_1ec;
  size_t local_1e8;
  int local_1e0;
  int local_1dc;
  const_reference local_1d8;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_1c8;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_1c0;
  int local_1ac;
  reference local_1a8;
  undefined8 *local_1a0;
  const_reference local_198;
  undefined1 local_18d;
  int local_18c;
  const_reference local_188;
  undefined8 *local_180;
  undefined8 *local_170;
  undefined8 *local_160;
  undefined1 local_14d;
  int local_14c;
  reference local_148;
  undefined8 *local_140;
  undefined8 *local_130;
  reference local_128;
  Allocator *local_120;
  int local_114;
  size_t local_110;
  void *local_108;
  int local_fc;
  int local_f8;
  int local_f4;
  undefined8 *local_f0;
  Allocator *local_e8;
  int local_dc;
  size_t local_d8;
  void *local_d0;
  int local_c4;
  int local_c0;
  int local_bc;
  undefined8 *local_b8;
  undefined4 local_ac;
  long local_a8;
  undefined4 local_9c;
  long local_98;
  undefined8 *local_68;
  undefined8 *local_48;
  
  _c = (int)((ulong)in_stack_fffffffffffffc80 >> 0x20);
  local_1c8 = in_RDX;
  local_1c0 = in_RSI;
  local_1d8 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,0);
  local_1dc = local_1d8->w;
  local_1e0 = local_1d8->h;
  local_1e8 = local_1d8->elemsize;
  local_1ec = local_1d8->c;
  local_1f8 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_1c0,1);
  local_200 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_1c8,0);
  Mat::create(in_stack_fffffffffffffc90,(int)((ulong)in_stack_fffffffffffffc88 >> 0x20),
              (int)in_stack_fffffffffffffc88,_c,in_stack_fffffffffffffc78,in_stack_fffffffffffffc70)
  ;
  local_1a8 = local_200;
  bVar4 = true;
  if (local_200->data != (void *)0x0) {
    local_128 = local_200;
    bVar4 = local_200->cstep * (long)local_200->c == 0;
  }
  if (bVar4) {
    local_1ac = -100;
  }
  else {
    local_198 = local_1f8;
    local_208 = (float *)local_1f8->data;
    dVar6 = std::round((double)(ulong)(uint)(*local_208 * *(float *)(in_RDI + 0xd8)));
    local_20c = (int)SUB84(dVar6,0);
    dVar6 = std::round((double)(ulong)(uint)(local_208[1] * *(float *)(in_RDI + 0xd8)));
    local_210 = (int)SUB84(dVar6,0);
    dVar6 = std::round((double)(ulong)(uint)(local_208[2] * *(float *)(in_RDI + 0xd8)));
    local_214 = (int)SUB84(dVar6,0);
    dVar6 = std::round((double)(ulong)(uint)(local_208[3] * *(float *)(in_RDI + 0xd8)));
    local_218 = (int)SUB84(dVar6,0);
    local_220 = (local_214 - local_20c) + 1;
    local_224 = 1;
    piVar2 = std::max<int>(&local_220,&local_224);
    local_21c = *piVar2;
    local_22c = (local_218 - local_210) + 1;
    local_230 = 1;
    piVar2 = std::max<int>(&local_22c,&local_230);
    local_228 = *piVar2;
    local_234 = (float)local_21c / (float)*(int *)(in_RDI + 0xd0);
    local_238 = (float)local_228 / (float)*(int *)(in_RDI + 0xd4);
    uVar1 = extraout_XMM0_Db;
    for (local_23c = 0; local_23c < local_1ec; local_23c = local_23c + 1) {
      local_180 = &local_290;
      local_bc = local_1d8->w;
      local_c0 = local_1d8->h;
      local_c4 = local_1d8->d;
      local_248 = (void *)((long)local_1d8->data +
                          local_1d8->cstep * (long)local_23c * local_1d8->elemsize);
      local_d8 = local_1d8->elemsize;
      local_dc = local_1d8->elempack;
      local_e8 = local_1d8->allocator;
      local_b8 = &local_290;
      local_a8 = (long)local_bc * (long)local_c0 * local_d8;
      local_1a0 = &local_290;
      local_170 = &local_290;
      local_140 = &local_2f0;
      local_f4 = local_200->w;
      local_f8 = local_200->h;
      local_fc = local_200->d;
      local_2a8 = (void *)((long)local_200->data +
                          local_200->cstep * (long)local_23c * local_200->elemsize);
      local_110 = local_200->elemsize;
      local_114 = local_200->elempack;
      local_120 = local_200->allocator;
      local_f0 = &local_2f0;
      local_98 = (long)local_f4 * (long)local_f8 * local_110;
      local_130 = &local_2f0;
      local_160 = &local_2f0;
      local_258 = 0;
      local_25c = 0;
      local_260 = 0;
      local_264 = 0;
      local_278 = 0;
      local_280 = 0;
      local_288 = 0;
      local_290 = 0;
      local_9c = 0x10;
      local_ac = 0x10;
      local_148 = local_200;
      local_14c = local_23c;
      local_14d = 1;
      local_188 = local_1d8;
      local_18c = local_23c;
      local_18d = 1;
      local_250 = 0;
      local_268 = 0;
      local_2f0 = 0;
      local_2e0 = 0;
      local_2d8 = 0;
      local_2c8 = 0;
      local_2c4 = 0;
      local_2c0 = 0;
      local_2bc = 0;
      local_2b8 = 0;
      local_2b0 = 0;
      local_2e8 = 0;
      local_108 = local_2a8;
      local_d0 = local_248;
      local_68 = local_160;
      local_48 = local_170;
      local_2d0 = local_120;
      local_270 = local_e8;
      for (local_2f4 = 0; local_2f4 < *(int *)(in_RDI + 0xd4); local_2f4 = local_2f4 + 1) {
        for (local_2f8 = 0; local_2f8 < *(int *)(in_RDI + 0xd0); local_2f8 = local_2f8 + 1) {
          fVar5 = (float)local_210;
          dVar6 = std::floor((double)CONCAT44(uVar1,(float)local_2f4 * local_238));
          local_2fc = (int)(fVar5 + SUB84(dVar6,0));
          fVar5 = (float)local_20c;
          dVar6 = std::floor((double)(ulong)(uint)((float)local_2f8 * local_234));
          local_300 = (int)(fVar5 + SUB84(dVar6,0));
          fVar5 = (float)local_210;
          dVar6 = std::ceil((double)(ulong)(uint)((float)(local_2f4 + 1) * local_238));
          local_304 = (int)(fVar5 + SUB84(dVar6,0));
          fVar5 = (float)local_20c;
          dVar6 = std::ceil((double)(ulong)(uint)((float)(local_2f8 + 1) * local_234));
          local_318[4] = (int)(fVar5 + SUB84(dVar6,0));
          local_318[3] = 0;
          piVar2 = std::max<int>(&local_2fc,local_318 + 3);
          piVar2 = std::min<int>(piVar2,&local_1e0);
          local_2fc = *piVar2;
          local_318[2] = 0;
          piVar2 = std::max<int>(&local_300,local_318 + 2);
          piVar2 = std::min<int>(piVar2,&local_1dc);
          local_300 = *piVar2;
          local_318[1] = 0;
          piVar2 = std::max<int>(&local_304,local_318 + 1);
          piVar2 = std::min<int>(piVar2,&local_1e0);
          local_304 = *piVar2;
          local_318[0] = 0;
          piVar2 = std::max<int>(local_318 + 4,local_318);
          piVar2 = std::min<int>(piVar2,&local_1dc);
          local_318[4] = *piVar2;
          local_391 = local_304 <= local_2fc || local_318[4] <= local_300;
          local_319 = local_391;
          if (local_304 <= local_2fc || local_318[4] <= local_300) {
            local_3a8 = 0.0;
          }
          else {
            local_3a8 = *(float *)((long)local_248 + (long)(local_2fc * local_1dc + local_300) * 4);
          }
          local_320 = local_3a8;
          for (local_324 = local_2fc; local_324 < local_304; local_324 = local_324 + 1) {
            for (local_328 = local_300; local_328 < local_318[4]; local_328 = local_328 + 1) {
              pfVar3 = std::max<float>(&local_320,
                                       (float *)((long)local_248 +
                                                (long)(local_324 * local_1dc + local_328) * 4));
              local_320 = *pfVar3;
            }
          }
          uVar1 = 0;
          *(float *)((long)local_2a8 + (long)local_2f8 * 4) = local_320;
        }
        local_2a8 = (void *)((long)local_2a8 + (long)*(int *)(in_RDI + 0xd0) * 4);
      }
    }
    local_1ac = 0;
  }
  return local_1ac;
}

Assistant:

int ROIPooling::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    size_t elemsize = bottom_blob.elemsize;
    int channels = bottom_blob.c;

    const Mat& roi_blob = bottom_blobs[1];

    Mat& top_blob = top_blobs[0];
    top_blob.create(pooled_width, pooled_height, channels, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // For each ROI R = [x y w h]: max pool over R
    const float* roi_ptr = roi_blob;

    int roi_x1 = static_cast<int>(round(roi_ptr[0] * spatial_scale));
    int roi_y1 = static_cast<int>(round(roi_ptr[1] * spatial_scale));
    int roi_x2 = static_cast<int>(round(roi_ptr[2] * spatial_scale));
    int roi_y2 = static_cast<int>(round(roi_ptr[3] * spatial_scale));

    int roi_w = std::max(roi_x2 - roi_x1 + 1, 1);
    int roi_h = std::max(roi_y2 - roi_y1 + 1, 1);

    float bin_size_w = (float)roi_w / (float)pooled_width;
    float bin_size_h = (float)roi_h / (float)pooled_height;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* ptr = bottom_blob.channel(q);
        float* outptr = top_blob.channel(q);

        for (int ph = 0; ph < pooled_height; ph++)
        {
            for (int pw = 0; pw < pooled_width; pw++)
            {
                // Compute pooling region for this output unit:
                //  start (included) = floor(ph * roi_height / pooled_height)
                //  end (excluded) = ceil((ph + 1) * roi_height / pooled_height)
                int hstart = static_cast<int>(roi_y1 + floor((float)(ph)*bin_size_h));
                int wstart = static_cast<int>(roi_x1 + floor((float)(pw)*bin_size_w));
                int hend = static_cast<int>(roi_y1 + ceil((float)(ph + 1) * bin_size_h));
                int wend = static_cast<int>(roi_x1 + ceil((float)(pw + 1) * bin_size_w));

                hstart = std::min(std::max(hstart, 0), h);
                wstart = std::min(std::max(wstart, 0), w);
                hend = std::min(std::max(hend, 0), h);
                wend = std::min(std::max(wend, 0), w);

                bool is_empty = (hend <= hstart) || (wend <= wstart);

                float max = is_empty ? 0.f : ptr[hstart * w + wstart];

                for (int y = hstart; y < hend; y++)
                {
                    for (int x = wstart; x < wend; x++)
                    {
                        int index = y * w + x;
                        max = std::max(max, ptr[index]);
                    }
                }

                outptr[pw] = max;
            }

            outptr += pooled_width;
        }
    }

    return 0;
}